

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void store_update(void)

{
  town *ptVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long lVar5;
  store *unaff_R14;
  store *s;
  
  if ((player->opts).opt[0x1a] == true) {
    msg("Updating Shops...");
  }
  do {
    do {
      if (daycount == 0) {
        daycount = 0;
        if ((player->opts).opt[0x1a] != true) {
          return;
        }
        msg("Done.");
        return;
      }
      daycount = daycount - 1;
      if (0 < world->num_towns) {
        lVar5 = 0;
        do {
          for (s = world->towns[lVar5].stores; s != (store *)0x0; s = s->next) {
            if (s->sidx != store_home_idx) {
              store_maint(s);
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < world->num_towns);
        unaff_R14 = (store *)0x0;
      }
      uVar3 = Rand_div((uint)z_info->store_shuffle);
    } while (uVar3 != 0);
    if ((player->opts).opt[0x1a] == true) {
      msg("Shuffling a Shopkeeper...");
    }
    do {
      uVar3 = Rand_div(world->num_towns);
      ptVar1 = world->towns;
      uVar4 = Rand_div((uint)z_info->store_max);
      if (uVar4 == store_home_idx) {
        bVar2 = false;
      }
      else {
        unaff_R14 = (store *)&ptVar1[(int)uVar3].stores;
        do {
          unaff_R14 = unaff_R14->next;
          bVar2 = unaff_R14 != (store *)0x0;
          if (unaff_R14 == (store *)0x0) break;
        } while (uVar4 != unaff_R14->sidx);
      }
    } while (!bVar2);
    store_shuffle(unaff_R14);
  } while( true );
}

Assistant:

void store_update(void)
{
	if (OPT(player, cheat_xtra)) msg("Updating Shops...");
	while (daycount--) {
		int i;
		struct store *s;

		/* Maintain each shop (except home) */
		for (i = 0; i < world->num_towns; i++) {
			struct town *town = &world->towns[i];
			for (s = town->stores; s; s = s->next) {
				/* Skip the home */
				if (store_is_home(s)) continue;

				/* Maintain */
				store_maint(s);
			}
		}

		/* Sometimes, shuffle the shop-keepers */
		if (one_in_(z_info->store_shuffle)) {
			/* Message */
			if (OPT(player, cheat_xtra)) msg("Shuffling a Shopkeeper...");

			/* Pick a random shop in a random town */
			while (1) {
				int m = randint0(world->num_towns);
				struct town *town = &world->towns[m];
				unsigned int n = randint0(z_info->store_max);
				if (n == store_home_idx) continue;
				for (s = town->stores; s; s = s->next) {
					if (n == s->sidx) break;
				}
				if (s) break;
			}

			/* Shuffle it */
			store_shuffle(s);
		}
	}
	daycount = 0;
	if (OPT(player, cheat_xtra)) msg("Done.");
}